

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O0

XMLSize_t __thiscall xercesc_4_0::ReaderMgr::getReaderDepth(ReaderMgr *this)

{
  ReaderMgr *local_20;
  XMLSize_t retVal;
  ReaderMgr *this_local;
  
  if (this->fReaderStack == (RefStackOf<xercesc_4_0::ReaderMgr::ReaderData> *)0x0) {
    this_local = (ReaderMgr *)0x0;
  }
  else {
    local_20 = (ReaderMgr *)RefStackOf<xercesc_4_0::ReaderMgr::ReaderData>::size(this->fReaderStack)
    ;
    if (this->fCurReader != (XMLReader *)0x0) {
      local_20 = (ReaderMgr *)((long)&(local_20->super_Locator)._vptr_Locator + 1);
    }
    this_local = local_20;
  }
  return (XMLSize_t)this_local;
}

Assistant:

XMLSize_t ReaderMgr::getReaderDepth() const
{
    // If the stack doesn't exist, its obviously zero
    if (!fReaderStack)
        return 0;

    //
    //  The return is the stack size, plus one if there is a current
    //  reader. So if there is no current reader and none on the stack,
    //  its zero, else its some non-zero value.
    //
    XMLSize_t retVal = fReaderStack->size();
    if (fCurReader)
        retVal++;
    return retVal;
}